

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O1

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_point
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VertexHandle _vh,Vec3f *_point
          )

{
  float fVar1;
  float fVar2;
  float fVar3;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_00;
  reference pvVar4;
  
  fVar1 = (_point->super_VectorDataT<float,_3>).values_[0];
  fVar2 = (_point->super_VectorDataT<float,_3>).values_[1];
  fVar3 = (_point->super_VectorDataT<float,_3>).values_[2];
  this_00 = PropertyContainer::property<OpenMesh::VectorT<double,3>>
                      ((PropertyContainer *)
                       &(this->mesh_->super_Mesh).
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        .field_0x8,
                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                       (this->mesh_->super_Mesh).
                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                       .
                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                       super_BaseHandle.idx_);
  pvVar4 = PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                     (this_00,(int)_vh.super_BaseHandle.idx_);
  (pvVar4->super_VectorDataT<double,_3>).values_[0] = (double)fVar1;
  (pvVar4->super_VectorDataT<double,_3>).values_[1] = (double)fVar2;
  (pvVar4->super_VectorDataT<double,_3>).values_[2] = (double)fVar3;
  return;
}

Assistant:

virtual void set_point(VertexHandle _vh, const Vec3f& _point)
  {
    mesh_.set_point(_vh,vector_cast<Point>(_point));
  }